

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O2

bool trt_pose::parse::munkresStep3
               (float *cost_graph,int M,PairGraph *star_graph,PairGraph *prime_graph,
               CoverTable *cover_table,pair<int,_int> *p,int nrows,int ncols)

{
  bool bVar1;
  int col;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int row;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)ncols;
  if (ncols < 1) {
    uVar4 = uVar5;
  }
  uVar3 = 0;
  if (0 < nrows) {
    uVar3 = (ulong)(uint)nrows;
  }
  do {
    if (uVar5 == uVar3) {
LAB_001042bd:
      return (long)uVar5 < (long)nrows;
    }
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      if ((cost_graph[uVar2] == 0.0) && (!NAN(cost_graph[uVar2]))) {
        row = (int)uVar5;
        col = (int)uVar2;
        bVar1 = utils::CoverTable::isCovered(cover_table,row,col);
        if (!bVar1) {
          (prime_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = col;
          (prime_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2] = row;
          if ((star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5] < 0) {
            p->first = row;
            p->second = col;
            goto LAB_001042bd;
          }
          utils::CoverTable::coverRow(cover_table,row);
          utils::CoverTable::uncoverCol
                    (cover_table,
                     (star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5]);
        }
      }
    }
    uVar5 = uVar5 + 1;
    cost_graph = cost_graph + M;
  } while( true );
}

Assistant:

bool munkresStep3(const float *cost_graph, const int M,
                  const PairGraph &star_graph, PairGraph &prime_graph,
                  CoverTable &cover_table, std::pair<int, int> &p,
                  const int nrows, const int ncols) {
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (cost_graph[i * M + j] == 0 && !cover_table.isCovered(i, j)) {
        prime_graph.set(i, j);
        if (star_graph.isRowSet(i)) {
          cover_table.coverRow(i);
          cover_table.uncoverCol(star_graph.colForRow(i));
        } else {
          p.first = i;
          p.second = j;
          return 1;
        }
      }
    }
  }
  return 0;
}